

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

object __thiscall
pybind11::detail::object_api<pybind11::handle>::operator()
          (object_api<pybind11::handle> *this,object *args)

{
  handle *this_00;
  object *in_RDX;
  PyObject local_28;
  object *args_local;
  object_api<pybind11::handle> *this_local;
  
  args_local = args;
  this_local = this;
  collect_arguments<(pybind11::return_value_policy)1,pybind11::object&,void>
            ((detail *)&local_28,in_RDX);
  this_00 = derived((object_api<pybind11::handle> *)args);
  handle::ptr(this_00);
  simple_collector<(pybind11::return_value_policy)1>::call
            ((simple_collector<(pybind11::return_value_policy)1> *)this,&local_28);
  simple_collector<(pybind11::return_value_policy)1>::~simple_collector
            ((simple_collector<(pybind11::return_value_policy)1> *)&local_28);
  return (object)(handle)this;
}

Assistant:

object object_api<Derived>::operator()(Args &&...args) const {
    return detail::collect_arguments<policy>(std::forward<Args>(args)...).call(derived().ptr());
}